

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<ProString,_QString>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<ProString,_QString> *this)

{
  int iVar1;
  CutResult CVar2;
  char16_t *__src;
  char16_t *pcVar3;
  long lVar4;
  char16_t *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->b).d.ptr == (char16_t *)0x0 && (this->a).m_string.d.ptr == (char16_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0014b426:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = (this->a).m_length;
    lVar4 = (this->b).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,iVar1 + lVar4,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar4 = (long)(this->a).m_length;
    if (lVar4 != 0) {
      pcVar3 = (this->a).m_string.d.ptr;
      local_40 = (long)(this->a).m_offset;
      local_48 = lVar4;
      CVar2 = QtPrivate::QContainerImplHelper::mid((this->a).m_string.d.size,&local_40,&local_48);
      __src = (char16_t *)0x0;
      if (CVar2 != Null) {
        __src = pcVar3 + local_40;
      }
      memcpy(__dest,__src,lVar4 * 2);
      __dest = __dest + lVar4;
    }
    lVar4 = (this->b).d.size;
    if (lVar4 != 0) {
      pcVar3 = (this->b).d.ptr;
      if (pcVar3 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,pcVar3,lVar4 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0014b426;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }